

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> * __thiscall
soul::ResolutionPass::FunctionResolver::findAllPossibleFunctions
          (ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
           *__return_storage_ptr__,FunctionResolver *this,CallOrCast *call,QualifiedIdentifier *name
          )

{
  IdentifierPath *this_00;
  ResolutionPass *pRVar1;
  void *pvVar2;
  pool_ref<soul::AST::Expression> *ppVar3;
  size_t sVar4;
  pool_ref<soul::AST::ASTObject> *ppVar5;
  Identifier i;
  Type *pTVar6;
  Structure *pSVar7;
  CommaSeparatedList *pCVar8;
  Function *pFVar9;
  long lVar10;
  long lVar11;
  ArrayView<soul::Type> argTypes_00;
  ArrayView<soul::pool_ptr<soul::AST::Constant>_> constantArgValues;
  pool_ref<soul::AST::ASTObject> local_240;
  pool_ptr<soul::AST::Function> f;
  ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL> constantArgs;
  PossibleFunction local_1d8;
  NameSearch local_1c8;
  TypeArray argTypes;
  
  AST::CallOrCastBase::getArgumentTypes(&argTypes,&call->super_CallOrCastBase);
  local_1c8.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_1c8.itemsFound.space;
  local_1c8.itemsFound.numActive = 0;
  local_1c8.itemsFound.numAllocated = 8;
  local_1c8.partiallyQualifiedPath.pathSections.items =
       (Identifier *)local_1c8.partiallyQualifiedPath.pathSections.space;
  local_1c8.partiallyQualifiedPath.pathSections.numActive = 0;
  local_1c8.partiallyQualifiedPath.pathSections.numAllocated = 8;
  local_1c8.stopAtFirstScopeWithResults = false;
  local_1c8.requiredNumFunctionArgs = -1;
  local_1c8.findVariables = true;
  local_1c8.findTypes = true;
  local_1c8.findFunctions = true;
  local_1c8.findNamespaces = true;
  local_1c8.findProcessors = true;
  local_1c8.findProcessorInstances = false;
  local_1c8.findEndpoints = true;
  local_1c8.onlyFindLocalVariables = false;
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&constantArgs,name);
  this_00 = &local_1c8.partiallyQualifiedPath;
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&this_00->pathSections,(ArrayWithPreallocation<soul::Identifier,_8UL> *)&constantArgs);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&constantArgs);
  local_1c8.stopAtFirstScopeWithResults = false;
  local_1c8.requiredNumFunctionArgs = (int)argTypes.numActive;
  local_1c8.findVariables = false;
  local_1c8.findTypes = false;
  local_1c8.findFunctions = true;
  local_1c8.findNamespaces = false;
  local_1c8.findProcessors = false;
  local_1c8.findProcessorInstances = false;
  local_1c8.findEndpoints = false;
  AST::Scope::performFullNameSearch
            ((call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
             parentScope,&local_1c8,(Statement *)0x0);
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&constantArgs,name);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&constantArgs);
  if (constantArgs.numActive == 1) {
    pRVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).owner;
    i = IdentifierPath::getLastPart(this_00);
    IdentifierPath::withSuffix((IdentifierPath *)&constantArgs,&pRVar1->intrinsicsNamespacePath,i);
    ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
              (&this_00->pathSections,(ArrayWithPreallocation<soul::Identifier,_8UL> *)&constantArgs
              );
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear
              ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&constantArgs);
    AST::Scope::performFullNameSearch
              ((call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context
               .parentScope,&local_1c8,(Statement *)0x0);
    if ((call->super_CallOrCastBase).isMethodCall == true) {
      if (CONCAT44(argTypes.numActive._4_4_,(int)argTypes.numActive) == 0) {
        throwInternalCompilerError("argTypes.size() != 0","findAllPossibleFunctions",0x99f);
      }
      pTVar6 = ArrayWithPreallocation<soul::Type,_8UL>::front(&argTypes);
      if (pTVar6->category == structure) {
        pTVar6 = ArrayWithPreallocation<soul::Type,_8UL>::front(&argTypes);
        pSVar7 = Type::getStructRef(pTVar6);
        pvVar2 = pSVar7->backlinkToASTObject;
        if (pvVar2 != (void *)0x0) {
          AST::QualifiedIdentifier::getPath((IdentifierPath *)&constantArgs,name);
          ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
                    (&this_00->pathSections,
                     (ArrayWithPreallocation<soul::Identifier,_8UL> *)&constantArgs);
          ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                    ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&constantArgs);
          AST::Scope::performFullNameSearch
                    (*(Scope **)((long)pvVar2 + 0x20),&local_1c8,(Statement *)0x0);
        }
      }
    }
  }
  constantArgs.items = (pool_ptr<soul::AST::Constant> *)constantArgs.space;
  constantArgs.numActive = 0;
  constantArgs.numAllocated = 4;
  if ((call->super_CallOrCastBase).arguments.object == (CommaSeparatedList *)0x0) {
    ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::resize
              (&constantArgs,CONCAT44(argTypes.numActive._4_4_,(int)argTypes.numActive));
  }
  else {
    ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::reserve
              (&constantArgs,CONCAT44(argTypes.numActive._4_4_,(int)argTypes.numActive));
    pCVar8 = pool_ptr<soul::AST::CommaSeparatedList>::operator->
                       (&(call->super_CallOrCastBase).arguments);
    ppVar3 = (pCVar8->items).items;
    sVar4 = (pCVar8->items).numActive;
    for (lVar11 = 0; sVar4 << 3 != lVar11; lVar11 = lVar11 + 8) {
      (**(code **)(**(long **)((long)&ppVar3->object + lVar11) + 0x68))(&local_1d8);
      ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::push_back
                (&constantArgs,(pool_ptr<soul::AST::Constant> *)&local_1d8);
    }
  }
  ppVar5 = local_1c8.itemsFound.items;
  __return_storage_ptr__->items = (PossibleFunction *)__return_storage_ptr__->space;
  __return_storage_ptr__->numActive = 0;
  __return_storage_ptr__->numAllocated = 4;
  lVar10 = local_1c8.itemsFound.numActive << 3;
  for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 8) {
    local_240.object = *(ASTObject **)((long)ppVar5 + lVar11);
    cast<soul::AST::Function,soul::AST::ASTObject>((soul *)&f,&local_240);
    if (f.object != (Function *)0x0) {
      pFVar9 = pool_ptr<soul::AST::Function>::operator->(&f);
      if ((pFVar9->originalGenericFunction).object == (Function *)0x0) {
        pFVar9 = pool_ptr<soul::AST::Function>::operator*(&f);
        argTypes_00.e = argTypes.items + CONCAT44(argTypes.numActive._4_4_,(int)argTypes.numActive);
        argTypes_00.s = argTypes.items;
        constantArgValues.e = constantArgs.items + constantArgs.numActive;
        constantArgValues.s = constantArgs.items;
        PossibleFunction::PossibleFunction(&local_1d8,pFVar9,argTypes_00,constantArgValues);
        ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>::
        push_back(__return_storage_ptr__,&local_1d8);
      }
    }
  }
  ArrayWithPreallocation<soul::pool_ptr<soul::AST::Constant>,_4UL>::clear(&constantArgs);
  AST::Scope::NameSearch::~NameSearch(&local_1c8);
  ArrayWithPreallocation<soul::Type,_8UL>::clear(&argTypes);
  return __return_storage_ptr__;
}

Assistant:

ArrayWithPreallocation<PossibleFunction, 4> findAllPossibleFunctions (const AST::CallOrCast& call,
                                                                              const AST::QualifiedIdentifier& name)
        {
            auto argTypes = call.getArgumentTypes();

            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = name.getPath();
            search.stopAtFirstScopeWithResults = false;
            search.requiredNumFunctionArgs = (int) argTypes.size();
            search.findVariables = false;
            search.findTypes = false;
            search.findFunctions = true;
            search.findNamespaces = false;
            search.findProcessors = false;
            search.findProcessorInstances = false;
            search.findEndpoints = false;

            call.getParentScope()->performFullNameSearch (search, nullptr);

            if (name.getPath().isUnqualified())
            {
                // Handle intrinsics with no explicit namespace
                search.partiallyQualifiedPath = owner.intrinsicsNamespacePath.withSuffix (search.partiallyQualifiedPath.getLastPart());
                call.getParentScope()->performFullNameSearch (search, nullptr);

                // Handle "Koenig" lookup for method calls
                if (call.isMethodCall)
                {
                    SOUL_ASSERT (argTypes.size() != 0);

                    if (argTypes.front().isStruct())
                    {
                        if (auto ownerASTObject = argTypes.front().getStructRef().backlinkToASTObject)
                        {
                            auto structDecl = reinterpret_cast<AST::StructDeclaration*> (ownerASTObject);

                            search.partiallyQualifiedPath = name.getPath();
                            structDecl->context.parentScope->performFullNameSearch (search, nullptr);
                        }
                    }
                }
            }

            ArrayWithPreallocation<pool_ptr<AST::Constant>, 4> constantArgs;

            if (call.arguments != nullptr)
            {
                constantArgs.reserve (argTypes.size());

                for (auto& c : call.arguments->items)
                    constantArgs.push_back (c->getAsConstant());
            }
            else
            {
                constantArgs.resize (argTypes.size());
            }

            ArrayWithPreallocation<PossibleFunction, 4> results;

            for (auto& i : search.itemsFound)
                if (auto f = cast<AST::Function> (i))
                    if (f->originalGenericFunction == nullptr)
                        results.push_back (PossibleFunction (*f, argTypes, constantArgs));

            return results;
        }